

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O1

void fdjac(custom_gradient *funcgrad,double *x,int N,double *jac,double *dx,double eps2,double *J)

{
  double dVar1;
  double *__ptr;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  
  __ptr = (double *)malloc((long)N * 8);
  if (0 < N) {
    uVar5 = (ulong)(uint)N;
    uVar4 = 0;
    do {
      dVar6 = x[uVar4];
      if (ABS(dVar6) < 1.0 / ABS(dx[uVar4])) {
        dVar6 = signx(dVar6);
        dVar6 = dVar6 / ABS(dx[uVar4]);
      }
      dVar1 = x[uVar4];
      dVar6 = dVar6 * eps2 + dVar1;
      x[uVar4] = dVar6;
      (*funcgrad->funcgrad)(x,N,__ptr,funcgrad->params);
      uVar3 = 0;
      pdVar2 = J;
      do {
        *pdVar2 = (__ptr[uVar3] - jac[uVar3]) / (dVar6 - dVar1);
        uVar3 = uVar3 + 1;
        pdVar2 = pdVar2 + uVar5;
      } while (uVar5 != uVar3);
      x[uVar4] = dVar1;
      uVar4 = uVar4 + 1;
      J = J + 1;
    } while (uVar4 != uVar5);
  }
  free(__ptr);
  return;
}

Assistant:

void fdjac(custom_gradient *funcgrad, double *x, int N, double *jac, double *dx, double eps2, double *J) {
	int i,j;
	double stepsize,temp,stepmax;
	double *fj;

	fj = (double*) malloc(sizeof(double) *N);

	for(j = 0; j < N;++j) {

		if (fabs(x[j]) >= (1.0 / fabs(dx[j]))) {
			stepmax = x[j];
		} else {
			stepmax = signx(x[j]) * 1.0 / fabs(dx[j]);
		}

		stepsize = eps2 * stepmax;
		temp = x[j];
		x[j] += stepsize;
		stepsize = x[j] - temp;
		FUNCGRAD_EVAL(funcgrad, x, N, fj);

		for(i = 0;i < N;++i) {
			J[i*N+j] = (fj[i] - jac[i]) / stepsize;
		}
		x[j] = temp;

	}

	free(fj);
}